

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

FloatParts sf_canonicalize(FloatParts part,FloatFmt *parm,float_status *status)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t value;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  FloatParts FVar7;
  
  uVar6 = part._8_8_;
  uVar4 = part.frac;
  iVar5 = part.exp;
  if ((parm->exp_max == iVar5) && (parm->arm_althp == false)) {
    if (uVar4 == 0) {
      uVar6 = uVar6 & 0xffffff00ffffffff | 0x300000000;
      value = 0;
    }
    else {
      value = uVar4 << ((byte)parm->frac_shift & 0x3f);
      uVar3 = extract64(value,0x3d,1);
      uVar6 = uVar6 & 0xffffff00ffffffff | (ulong)((char)uVar3 == '\0') << 0x20 | 0x400000000;
    }
  }
  else if (iVar5 == 0) {
    if (uVar4 != 0) {
      if (status->flush_inputs_to_zero == '\0') {
        lVar1 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar2 = (uint)lVar1 ^ 0x3f;
        uVar6 = (ulong)((parm->frac_shift - (uVar2 + parm->exp_bias)) + 2) |
                uVar6 & 0xffffff0000000000 | 0x200000000;
        value = uVar4 << ((char)uVar2 - 1U & 0x3f);
        goto LAB_00b203e0;
      }
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    uVar6 = uVar6 & 0xffffff0000000000 | 0x100000000;
    value = 0;
  }
  else {
    uVar6 = (ulong)(uint)(iVar5 - parm->exp_bias) | uVar6 & 0xffffff0000000000 | 0x200000000;
    value = (uVar4 << ((byte)parm->frac_shift & 0x3f)) + 0x4000000000000000;
  }
LAB_00b203e0:
  FVar7.exp = (int)uVar6;
  FVar7.cls = (char)(uVar6 >> 0x20);
  FVar7.sign = (_Bool)(char)(uVar6 >> 0x28);
  FVar7._14_2_ = (short)(uVar6 >> 0x30);
  FVar7.frac = value;
  return FVar7;
}

Assistant:

static FloatParts sf_canonicalize(FloatParts part, const FloatFmt *parm,
                                  float_status *status)
{
    if (part.exp == parm->exp_max && !parm->arm_althp) {
        if (part.frac == 0) {
            part.cls = float_class_inf;
        } else {
            part.frac <<= parm->frac_shift;
            part.cls = (parts_is_snan_frac(part.frac, status)
                        ? float_class_snan : float_class_qnan);
        }
    } else if (part.exp == 0) {
        if (likely(part.frac == 0)) {
            part.cls = float_class_zero;
        } else if (status->flush_inputs_to_zero) {
            float_raise(float_flag_input_denormal, status);
            part.cls = float_class_zero;
            part.frac = 0;
        } else {
            int shift = clz64(part.frac) - 1;
            part.cls = float_class_normal;
            part.exp = parm->frac_shift - parm->exp_bias - shift + 1;
            part.frac <<= shift;
        }
    } else {
        part.cls = float_class_normal;
        part.exp -= parm->exp_bias;
        part.frac = DECOMPOSED_IMPLICIT_BIT + (part.frac << parm->frac_shift);
    }
    return part;
}